

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

bool __thiscall
ThreadedReplayer::enqueue_create_render_pass2
          (ThreadedReplayer *this,Hash index,VkRenderPassCreateInfo2 *create_info,
          VkRenderPass *render_pass)

{
  mapped_type pVVar1;
  PFN_vkCreateRenderPass2KHR p_Var2;
  bool bVar3;
  VkResult VVar4;
  PerThreadData *pPVar5;
  pointer pVVar6;
  FeatureFilter *this_00;
  VkDevice pVVar7;
  mapped_type *ppVVar8;
  VkRenderPass *render_pass_local;
  VkRenderPassCreateInfo2 *create_info_local;
  Hash index_local;
  ThreadedReplayer *this_local;
  
  create_info_local = (VkRenderPassCreateInfo2 *)index;
  index_local = (Hash)this;
  pPVar5 = get_per_thread_data(this);
  if (pPVar5->expected_tag == RESOURCE_RENDER_PASS) {
    pVVar6 = std::unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
             ::operator->(&this->device);
    this_00 = Fossilize::VulkanDevice::get_feature_filter(pVVar6);
    bVar3 = Fossilize::FeatureFilter::render_pass2_is_supported(this_00,create_info);
    p_Var2 = vkCreateRenderPass2KHR;
    if (bVar3) {
      pVVar6 = std::
               unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
               operator->(&this->device);
      pVVar7 = Fossilize::VulkanDevice::get_device(pVVar6);
      VVar4 = (*p_Var2)(pVVar7,create_info,(VkAllocationCallbacks *)0x0,render_pass);
      if (VVar4 == VK_SUCCESS) {
        pVVar1 = *render_pass;
        ppVVar8 = std::
                  unordered_map<unsigned_long,_VkRenderPass_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkRenderPass_T_*>_>_>
                  ::operator[](&this->render_passes,(key_type *)&create_info_local);
        *ppVVar8 = pVVar1;
        this_local._7_1_ = true;
      }
      else {
        fprintf(_stderr,"Fossilize ERROR: Creating render pass %0lX Failed!\n",create_info_local);
        fflush(_stderr);
        this_local._7_1_ = false;
      }
    }
    else {
      fprintf(_stderr,"Fossilize WARN: Render pass (version 2) %016lx is not supported. Skipping.\n"
              ,create_info_local);
      fflush(_stderr);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool enqueue_create_render_pass2(Hash index, const VkRenderPassCreateInfo2 *create_info, VkRenderPass *render_pass) override
	{
		if (get_per_thread_data().expected_tag != RESOURCE_RENDER_PASS)
			return false;

		if (!device->get_feature_filter().render_pass2_is_supported(create_info))
		{
			LOGW("Render pass (version 2) %016" PRIx64 " is not supported. Skipping.\n", index);
			return false;
		}

		// Playback in-order.
		if (vkCreateRenderPass2KHR(device->get_device(), create_info, nullptr, render_pass) != VK_SUCCESS)
		{
			LOGE("Creating render pass %0" PRIX64 " Failed!\n", index);
			return false;
		}
		render_passes[index] = *render_pass;
		return true;
	}